

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O2

void compact_with_snapshot_open_multi_kvs_test(void)

{
  fdb_kvs_handle *pfVar1;
  fdb_status fVar2;
  size_t sVar3;
  size_t sVar4;
  int iVar5;
  ulong uVar6;
  char *__format;
  fdb_file_handle *dbfile;
  int local_3a4;
  fdb_kvs_handle *db5;
  fdb_kvs_handle *db4;
  fdb_kvs_handle *db3;
  fdb_kvs_handle *db2;
  fdb_kvs_handle *db1;
  cb_args cb_args;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char bodybuf [256];
  char keybuf [256];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.compaction_cb_ctx = &cb_args;
  cb_args.handle = (fdb_kvs_handle *)0x0;
  cb_args.n_moved_docs = 0;
  cb_args.n_batch_move = 0;
  cb_args.begin = false;
  cb_args.end = false;
  cb_args.wal_flush = false;
  cb_args._11_5_ = 0;
  fconfig.wal_threshold = 0x400;
  fconfig.flags = 1;
  fconfig.compaction_cb = compaction_cb_markers;
  fconfig.compaction_cb_mask = 0x1b;
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_open(&dbfile,"./compact_test1",&fconfig);
  fdb_kvs_open(dbfile,&db1,"db1",&kvs_config);
  fdb_kvs_open(dbfile,&db2,"db2",&kvs_config);
  fdb_kvs_open(dbfile,&db3,"db3",&kvs_config);
  fdb_kvs_open(dbfile,&db4,"db4",&kvs_config);
  fdb_kvs_open(dbfile,&db5,"db5",&kvs_config);
  iVar5 = 0;
  while (iVar5 != 5) {
    local_3a4 = iVar5;
    for (uVar6 = 0; (int)uVar6 != 1000; uVar6 = (ulong)((int)uVar6 + 1)) {
      sprintf(keybuf,"key%04d",uVar6);
      sprintf(bodybuf,"body%04d",uVar6);
      pfVar1 = db1;
      sVar3 = strlen(keybuf);
      sVar4 = strlen(bodybuf);
      fdb_set_kv(pfVar1,keybuf,sVar3,bodybuf,sVar4);
      pfVar1 = db2;
      sVar3 = strlen(keybuf);
      sVar4 = strlen(bodybuf);
      fdb_set_kv(pfVar1,keybuf,sVar3,bodybuf,sVar4);
      pfVar1 = db3;
      sVar3 = strlen(keybuf);
      sVar4 = strlen(bodybuf);
      fdb_set_kv(pfVar1,keybuf,sVar3,bodybuf,sVar4);
      pfVar1 = db4;
      sVar3 = strlen(keybuf);
      sVar4 = strlen(bodybuf);
      fdb_set_kv(pfVar1,keybuf,sVar3,bodybuf,sVar4);
      pfVar1 = db5;
      sVar3 = strlen(keybuf);
      sVar4 = strlen(bodybuf);
      fdb_set_kv(pfVar1,keybuf,sVar3,bodybuf,sVar4);
    }
    fVar2 = fdb_commit(dbfile,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0xc74);
      compact_with_snapshot_open_multi_kvs_test()::__test_pass = 1;
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xc74,"void compact_with_snapshot_open_multi_kvs_test()");
    }
    iVar5 = local_3a4 + 1;
    cb_args.n_moved_docs = iVar5 * 1000;
    fVar2 = fdb_compact(dbfile,(char *)0x0);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0xc79);
      compact_with_snapshot_open_multi_kvs_test()::__test_pass = 1;
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xc79,"void compact_with_snapshot_open_multi_kvs_test()");
    }
  }
  fVar2 = fdb_close(dbfile);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xc7d);
    compact_with_snapshot_open_multi_kvs_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xc7d,"void compact_with_snapshot_open_multi_kvs_test()");
  }
  fVar2 = fdb_shutdown();
  if (fVar2 == FDB_RESULT_SUCCESS) {
    __format = "%s PASSED\n";
    if (compact_with_snapshot_open_multi_kvs_test()::__test_pass != '\0') {
      __format = "%s FAILED\n";
    }
    fprintf(_stderr,__format,"compact with snapshot_open multi kvs test");
    return;
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
          ,0xc7f);
  compact_with_snapshot_open_multi_kvs_test()::__test_pass = 1;
  __assert_fail("s == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xc7f,"void compact_with_snapshot_open_multi_kvs_test()");
}

Assistant:

void compact_with_snapshot_open_multi_kvs_test()
{
    TEST_INIT();
    memleak_start();

    int i, j, r;
    int n = 1000;
    char keybuf[256], bodybuf[256];
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db1, *db2, *db3, *db4, *db5;
    fdb_status s;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    struct cb_args cb_args;

    memset(&cb_args, 0x0, sizeof(struct cb_args));

    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_cb = compaction_cb_markers;
    fconfig.compaction_cb_ctx = &cb_args;
    fconfig.compaction_cb_mask = FDB_CS_BEGIN |
                                 FDB_CS_MOVE_DOC |
                                 FDB_CS_FLUSH_WAL |
                                 FDB_CS_END;

    // remove previous compact_test files
    r = system(SHELL_DEL" compact_test* > errorlog.txt");
    (void)r;

    // open two handles for kvs
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    fdb_kvs_open(dbfile, &db1, "db1", &kvs_config);
    fdb_kvs_open(dbfile, &db2, "db2", &kvs_config);
    fdb_kvs_open(dbfile, &db3, "db3", &kvs_config);
    fdb_kvs_open(dbfile, &db4, "db4", &kvs_config);
    fdb_kvs_open(dbfile, &db5, "db5", &kvs_config);
    for (j=0;j<5;++j){
        for (i=0;i<n;++i){
            sprintf(keybuf, "key%04d", i);
            sprintf(bodybuf, "body%04d", i);
            fdb_set_kv(db1, keybuf, strlen(keybuf), bodybuf, strlen(bodybuf));
            fdb_set_kv(db2, keybuf, strlen(keybuf), bodybuf, strlen(bodybuf));
            fdb_set_kv(db3, keybuf, strlen(keybuf), bodybuf, strlen(bodybuf));
            fdb_set_kv(db4, keybuf, strlen(keybuf), bodybuf, strlen(bodybuf));
            fdb_set_kv(db5, keybuf, strlen(keybuf), bodybuf, strlen(bodybuf));
        }

        // commit
        s = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_CHK(s == FDB_RESULT_SUCCESS);

        // compact
        cb_args.n_moved_docs = n*(j+1);
        s = fdb_compact(dbfile, NULL);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }

    s = fdb_close(dbfile);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_shutdown();
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    TEST_RESULT("compact with snapshot_open multi kvs test");
}